

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *stream;
  pointer pMVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  byte bVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  Code CVar12;
  Code CVar13;
  pointer pMVar14;
  bool bVar15;
  long local_b8;
  char local_a9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined1 local_a0 [12];
  uint uStack_94;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ColourGuard local_48;
  char *local_38;
  
  iVar5 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  bVar8 = 1;
  if ((char)iVar5 == '\0') {
    bVar8 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(_assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  if (((bVar8 == 0) &&
      (OVar1 = (_assertionStats->assertionResult).m_resultData.resultType, OVar1 != ExplicitSkip))
     && (OVar1 != Warning)) {
    return;
  }
  lazyPrint(this);
  stream = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  CVar12 = None;
  CVar13 = None;
  local_38 = "";
  if (0x10f < OVar1) {
    if (ThrewException < OVar1) {
      if (OVar1 == DidntThrowException) {
        local_38 = "because no exception was thrown where one was expected";
        lVar6 = 0x36;
      }
      else {
        pcVar11 = "";
        local_b8 = 0;
        lVar6 = 0;
        if (OVar1 != FatalErrorCondition) goto LAB_00161714;
        local_38 = "due to a fatal error condition";
        lVar6 = 0x1e;
      }
      goto LAB_001616fd;
    }
    if (OVar1 != Exception) {
      pcVar11 = "";
      local_b8 = 0;
      lVar6 = 0;
      CVar13 = CVar12;
      if (OVar1 == ThrewException) {
        lVar6 = ((long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        local_b8 = 6;
        CVar13 = BrightRed;
        pcVar11 = "FAILED";
        if (lVar6 == 0) {
          local_38 = "due to unexpected exception with ";
          lVar6 = 0x21;
        }
        else if (lVar6 == 1) {
          local_38 = "due to unexpected exception with message";
          lVar6 = 0x28;
        }
        else {
          local_38 = "due to unexpected exception with messages";
          lVar6 = 0x29;
        }
      }
      goto LAB_00161714;
    }
switchD_001613f5_caseD_ffffffff:
    local_b8 = 0x14;
    CVar12 = BrightRed;
    pcVar11 = "** internal error **";
LAB_0016150d:
    lVar6 = 0;
    CVar13 = CVar12;
    goto LAB_00161714;
  }
  switch(OVar1) {
  case Ok:
    lVar6 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar11 = "";
    if (lVar6 == 0x48) {
      pcVar11 = "with message";
    }
    lVar9 = 0xc;
    if (lVar6 != 0x48) {
      lVar9 = 0;
    }
    bVar4 = (ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_38 = "with messages";
    if (bVar4) {
      local_38 = pcVar11;
    }
    lVar6 = 0xd;
    if (bVar4) {
      lVar6 = lVar9;
    }
    local_b8 = 6;
    CVar13 = Green;
    pcVar11 = "PASSED";
    break;
  case Info:
    lVar6 = 4;
    local_38 = "info";
    goto LAB_0016166e;
  case Warning:
    lVar6 = 7;
    local_38 = "warning";
LAB_0016166e:
    pcVar11 = "";
    CVar13 = None;
    local_b8 = 0;
    break;
  default:
    local_b8 = 0;
    pcVar11 = local_38;
    goto LAB_0016150d;
  case ExplicitSkip:
    lVar6 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar11 = "";
    if (lVar6 == 0x48) {
      pcVar11 = "explicitly with message";
    }
    lVar9 = 0x17;
    if (lVar6 != 0x48) {
      lVar9 = 0;
    }
    bVar4 = (ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_38 = "explicitly with messages";
    if (bVar4) {
      local_38 = pcVar11;
    }
    lVar6 = 0x18;
    if (bVar4) {
      lVar6 = lVar9;
    }
    local_b8 = 7;
    CVar13 = FileName;
    pcVar11 = "SKIPPED";
    break;
  case ExpressionFailed:
    bVar15 = (OVar1 & FailureBit) == Ok;
    bVar4 = (char)(((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) >> 3
                  ) != '\0';
    pcVar11 = "FAILED";
    if (bVar4 || bVar15) {
      pcVar11 = "FAILED - but was ok";
    }
    CVar13 = BrightRed;
    if (bVar4 || bVar15) {
      CVar13 = Green;
    }
    local_b8 = 6;
    if (bVar4 || bVar15) {
      local_b8 = 0x13;
    }
    lVar6 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar10 = "";
    if (lVar6 == 0x48) {
      pcVar10 = "with message";
    }
    lVar9 = 0xc;
    if (lVar6 != 0x48) {
      lVar9 = 0;
    }
    bVar4 = (ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_38 = "with messages";
    if (bVar4) {
      local_38 = pcVar10;
    }
    lVar6 = 0xd;
    if (bVar4) {
      lVar6 = lVar9;
    }
    break;
  case ExplicitFailure:
    lVar6 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pcVar11 = "";
    if (lVar6 == 0x48) {
      pcVar11 = "explicitly with message";
    }
    lVar9 = 0x17;
    if (lVar6 != 0x48) {
      lVar9 = 0;
    }
    bVar4 = (ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2;
    local_38 = "explicitly with messages";
    if (bVar4) {
      local_38 = pcVar11;
    }
    lVar6 = 0x18;
    if (bVar4) {
      lVar6 = lVar9;
    }
LAB_001616fd:
    local_b8 = 6;
    CVar13 = BrightRed;
    pcVar11 = "FAILED";
    break;
  case Unknown:
  case FailureBit:
    goto switchD_001613f5_caseD_ffffffff;
  }
LAB_00161714:
  local_a0._8_4_ = FileName;
  uStack_94 = uStack_94 & 0xffffff00;
  local_a0._0_8_ = local_a8;
  ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_a0,stream);
  local_68._0_8_ = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_68._8_8_ = (_assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<(stream,(SourceLineInfo *)local_68);
  std::__ostream_insert<char,std::char_traits<char>>(stream,": ",2);
  if (uStack_94._0_1_ == true) {
    (**(code **)(*(size_type *)local_a0._0_8_ + 0x10))(local_a0._0_8_,0);
  }
  if ((_assertionStats->totals).assertions.failed + (_assertionStats->totals).assertions.passed +
      (_assertionStats->totals).assertions.failedButOk +
      (_assertionStats->totals).assertions.skipped == 0) {
    local_a0[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(stream,local_a0,1);
  }
  else {
    if (local_b8 != 0) {
      local_a0._0_8_ = local_a8;
      uStack_94 = uStack_94 & 0xffffff00;
      local_a0._8_4_ = CVar13;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_a0,stream);
      poVar7 = (ostream *)std::ostream::write((char *)stream,(long)pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n",2);
      if (uStack_94._0_1_ == true) {
        (**(code **)(*(size_type *)local_a0._0_8_ + 0x10))(local_a0._0_8_,0);
      }
    }
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
      local_68._0_8_ = local_a8;
      local_68._8_5_ = 5;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_68,stream);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_
                ((string *)local_a0,&_assertionStats->assertionResult);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(char *)local_a0._0_8_,CONCAT44(uStack_94,local_a0._8_4_));
      local_48.m_colourImpl = (ColourImpl *)CONCAT71(local_48.m_colourImpl._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_48,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      }
      if (local_68[0xc] == true) {
        (**(code **)(*(size_type *)local_68._0_8_ + 0x10))(local_68._0_8_,0);
      }
    }
    bVar4 = AssertionResult::hasExpandedExpression(&_assertionStats->assertionResult);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"with expansion:\n",0x10);
      local_48.m_colourImpl = (ColourImpl *)local_a8;
      local_48.m_code = BrightYellow;
      local_48.m_engaged = false;
      ColourImpl::ColourGuard::engageImpl(&local_48,stream);
      AssertionResult::getExpandedExpression_abi_cxx11_
                ((string *)local_68,&_assertionStats->assertionResult);
      local_a0._0_8_ = &local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,local_68._0_8_,(char *)(local_68._0_8_ + local_68._8_8_));
      local_80 = 0x4f;
      local_70 = 0xffffffffffffffff;
      local_78 = 2;
      TextFlow::operator<<(stream,(Column *)local_a0);
      local_a9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&local_a9,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._0_8_ != &local_58) {
        operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
      }
      if (local_48.m_engaged == true) {
        (**(code **)(*(size_type *)local_48.m_colourImpl + 0x10))(local_48.m_colourImpl,0);
      }
    }
  }
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this;
  if (lVar6 != 0) {
    poVar7 = (ostream *)std::ostream::write((char *)stream,(long)local_38);
    local_a0[0] = (string)0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_a0,1);
    local_a0[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_a0,1);
  }
  pMVar14 = (_assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar2 = (_assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar14 != pMVar2) {
    do {
      if ((pMVar14->type != Info | bVar8) == 1) {
        pcVar3 = (pMVar14->message)._M_dataplus._M_p;
        local_a0._0_8_ = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,pcVar3,pcVar3 + (pMVar14->message)._M_string_length);
        local_80 = 0x4f;
        local_70 = 0xffffffffffffffff;
        local_78 = 2;
        TextFlow::operator<<(stream,(Column *)local_a0);
        local_68[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(stream,local_68,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._0_8_ != &local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
        }
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != pMVar2);
  }
  local_a0[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>
            ((((StreamingReporterBase *)local_a8)->super_ReporterBase).m_stream,local_a0,1);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}